

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O0

void __thiscall World::increaseSpeed(World *this)

{
  ostream *poVar1;
  float fVar2;
  double dVar3;
  float speedPercentage;
  World *this_local;
  
  if (this->gameSpeed * 2 < 0x8001) {
    this->gameSpeed = this->gameSpeed << 1;
    dVar3 = std::trunc((double)(ulong)(uint)((this->gameTime * (float)this->gameSpeed) / 128.0));
    this->lastGravityUpdate = (long)SUB84(dVar3,0);
    fVar2 = ((float)this->gameSpeed * 100.0) / 128.0;
    poVar1 = std::operator<<((ostream *)&std::cout,"game speed is now ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2);
    poVar1 = std::operator<<(poVar1," (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,fVar2 / 100.0);
    poVar1 = std::operator<<(poVar1,"x)");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void World::increaseSpeed() {
    if (gameSpeed * 2 <= 32768) {
        gameSpeed *= 2;
        lastGravityUpdate = trunc((gameTime * gameSpeed) / 128);
        float speedPercentage = 100.f * gameSpeed / 128;
        cout << "game speed is now " << speedPercentage << " (" << speedPercentage / 100 << "x)" << endl;
    }
}